

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

StreamInput *
pegmatite::StreamInput::Create(StreamInput *__return_storage_ptr__,string *name,istream *s)

{
  long lVar1;
  long lVar2;
  
  lVar1 = std::istream::tellg();
  std::istream::seekg((long)s,_S_beg);
  lVar2 = std::istream::tellg();
  std::istream::seekg((long)s,(_Ios_Seekdir)lVar1);
  StreamInput(__return_storage_ptr__,name,s,lVar2 - lVar1);
  return __return_storage_ptr__;
}

Assistant:

StreamInput StreamInput::Create(const std::string& name, std::istream& s)
{
	const std::streamoff start = s.tellg();
	s.seekg(0, std::ios::end);

	const std::streamoff len = s.tellg() - start;
	s.seekg(start, std::ios::beg);

	return StreamInput(name, s, static_cast<size_t>(len));
}